

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O0

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::X<Fad<double>>
          (TPZGeoBlend<pzgeom::TPZGeoLinear> *this,TPZFMatrix<double> *coord,
          TPZVec<Fad<double>_> *xi,TPZVec<Fad<double>_> *result)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int64_t iVar4;
  bool *pbVar5;
  TPZFMatrix<Fad<double>_> *this_00;
  TPZVec<Fad<double>_> *in_RCX;
  TPZVec<Fad<double>_> *in_RDX;
  long in_RDI;
  int x_6;
  int x_5;
  Fad<double> blendFactorSide;
  int x_4;
  TPZManVector<Fad<double>,_3> projectedPoint;
  int subSide;
  int subSideIndex;
  TPZStack<int,_10> allContainedSides;
  TPZStack<int,_10> containedNodesInSide;
  int x_3;
  TPZGeoElSide neighbour;
  TPZManVector<Fad<double>,_3> Xside;
  TPZManVector<Fad<double>,_3> neighXi_1;
  int sidedim;
  int x_2;
  int x_1;
  int currentNode;
  int iNode_1;
  TPZManVector<double,_3> nodeCoord;
  TPZFNMatrix<9,_Fad<double>_> sidePhi;
  int nSideNodes;
  MElementType sideType;
  TPZManVector<Fad<double>,_3> sideXi;
  TPZGeoElSide gelside;
  int side_1;
  int sideIndex_1;
  TPZFNMatrix<27,_Fad<double>_> nonLinearSideMappings;
  TPZFNMatrix<27,_Fad<double>_> linearSideMappings;
  TPZFNMatrix<27,_Fad<double>_> projectedPointOverSide;
  TPZManVector<Fad<double>,_20> blendFactor;
  int side;
  int sideIndex;
  TPZManVector<bool,_20> isRegularMapping;
  int x;
  int iNode;
  TPZFNMatrix<9,_Fad<double>_> phi;
  TPZManVector<Fad<double>,_3> neighXi;
  REAL zero;
  TPZFNMatrix<9,_Fad<double>_> notUsedHereMat;
  TPZManVector<Fad<double>,_3> notUsedHereVec;
  TPZGeoMesh *gmesh;
  Fad<double> *in_stack_ffffffffffffe338;
  TPZManVector<bool,_20> *in_stack_ffffffffffffe340;
  TPZGeoMesh *in_stack_ffffffffffffe348;
  TPZGeoMesh *in_stack_ffffffffffffe350;
  TPZGeoBlend<pzgeom::TPZGeoLinear> *in_stack_ffffffffffffe358;
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffe360;
  Fad<double> *in_stack_ffffffffffffe368;
  TPZManVector<bool,_20> *in_stack_ffffffffffffe370;
  Fad<double> *in_stack_ffffffffffffe378;
  undefined7 in_stack_ffffffffffffe380;
  undefined1 in_stack_ffffffffffffe387;
  Fad<double> *in_stack_ffffffffffffe388;
  TPZVec<Fad<double>_> *in_stack_ffffffffffffe390;
  long in_stack_ffffffffffffe398;
  TPZFNMatrix<9,_Fad<double>_> *in_stack_ffffffffffffe3a0;
  Fad<double> *in_stack_ffffffffffffe3b8;
  undefined4 in_stack_ffffffffffffe3c0;
  undefined4 in_stack_ffffffffffffe3c4;
  int64_t in_stack_ffffffffffffe3c8;
  TPZFNMatrix<27,_Fad<double>_> *in_stack_ffffffffffffe3d0;
  Fad<double> *in_stack_ffffffffffffe3d8;
  TPZManVector<Fad<double>,_3> *in_stack_ffffffffffffe3e0;
  TPZGeoBlend<pzgeom::TPZGeoLinear> *in_stack_ffffffffffffe3e8;
  TPZManVector<Fad<double>,_20> *in_stack_ffffffffffffe3f0;
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffe410;
  undefined4 in_stack_ffffffffffffe418;
  undefined4 in_stack_ffffffffffffe41c;
  undefined4 in_stack_ffffffffffffe420;
  undefined4 in_stack_ffffffffffffe424;
  Fad<double> *in_stack_ffffffffffffe428;
  undefined4 in_stack_ffffffffffffe434;
  int local_1b44;
  int local_1b20;
  int local_1af8;
  TPZVec<Fad<double>_> local_1ad0 [2];
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffe588;
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffe590;
  TPZVec<Fad<double>_> *in_stack_ffffffffffffe598;
  int in_stack_ffffffffffffe5a4;
  int local_1a4c;
  TPZVec<int> local_1a48 [2];
  TPZVec<int> local_1a00 [2];
  int local_19b4;
  undefined8 local_1998;
  TPZVec<Fad<double>_> local_1970;
  TPZVec<Fad<double>_> *in_stack_ffffffffffffe6b8;
  Fad<double> *in_stack_ffffffffffffe6c0;
  TPZVec<Fad<double>_> *in_stack_ffffffffffffe6c8;
  int *in_stack_ffffffffffffe6d0;
  size_t in_stack_ffffffffffffe758;
  char *in_stack_ffffffffffffe760;
  int local_1844;
  int local_181c;
  int in_stack_ffffffffffffe7e8;
  int in_stack_ffffffffffffe7ec;
  TPZVec<Fad<double>_> *in_stack_ffffffffffffe7f0;
  TPZVec<Fad<double>_> *in_stack_ffffffffffffe7f8;
  int in_stack_ffffffffffffe804;
  TPZVec<Fad<double>_> *in_stack_ffffffffffffe8a0;
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffe8a8;
  TPZVec<Fad<double>_> *in_stack_ffffffffffffe8b0;
  TPZVec<Fad<double>_> *in_stack_ffffffffffffe8b8;
  int in_stack_ffffffffffffe8c0;
  int in_stack_ffffffffffffe8c4;
  TPZGeoBlend<pzgeom::TPZGeoLinear> *in_stack_ffffffffffffe8c8;
  TPZGeoElSide local_1578;
  int local_1560;
  int local_155c;
  undefined8 local_1558;
  undefined8 local_1120;
  undefined8 local_ce8;
  undefined8 local_8b0;
  TPZVec<Fad<double>_> local_888 [21];
  int local_5e4;
  int local_5e0;
  undefined1 local_5d9;
  TPZVec<bool> local_5d8 [2];
  int local_580;
  int local_57c;
  undefined4 local_3a4;
  undefined4 local_304;
  undefined8 local_2e0;
  undefined4 local_2d4;
  undefined4 local_cc;
  TPZGeoMesh *local_28;
  TPZVec<Fad<double>_> *local_20;
  TPZVec<Fad<double>_> *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  if (*(long *)(in_RDI + 0x18) == 0) {
    pzinternal::DebugStopImpl(in_stack_ffffffffffffe760,in_stack_ffffffffffffe758);
  }
  local_28 = TPZGeoEl::Mesh(*(TPZGeoEl **)(in_RDI + 0x18));
  local_cc = 0;
  Fad<double>::Fad<int,_nullptr>
            ((Fad<double> *)in_stack_ffffffffffffe350,(int *)in_stack_ffffffffffffe348);
  TPZManVector<Fad<double>,_3>::TPZManVector
            ((TPZManVector<Fad<double>,_3> *)in_stack_ffffffffffffe3f0,
             (int64_t)in_stack_ffffffffffffe3e8,(Fad<double> *)in_stack_ffffffffffffe3e0);
  Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffe340);
  local_2d4 = 0;
  Fad<double>::Fad<int,_nullptr>
            ((Fad<double> *)in_stack_ffffffffffffe350,(int *)in_stack_ffffffffffffe348);
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
            ((TPZFNMatrix<9,_Fad<double>_> *)in_stack_ffffffffffffe3d0,in_stack_ffffffffffffe3c8,
             CONCAT44(in_stack_ffffffffffffe3c4,in_stack_ffffffffffffe3c0),in_stack_ffffffffffffe3b8
            );
  Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffe340);
  local_2e0 = 0x3d06849b86a12b9b;
  (*local_20->_vptr_TPZVec[3])(local_20,3);
  local_304 = 0;
  Fad<double>::Fad<int,_nullptr>
            ((Fad<double> *)in_stack_ffffffffffffe350,(int *)in_stack_ffffffffffffe348);
  TPZVec<Fad<double>_>::Fill
            (in_stack_ffffffffffffe390,in_stack_ffffffffffffe388,
             CONCAT17(in_stack_ffffffffffffe387,in_stack_ffffffffffffe380),
             (int64_t)in_stack_ffffffffffffe378);
  Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffe340);
  iVar4 = TPZGeoElSideIndex::ElementIndex((TPZGeoElSideIndex *)(in_RDI + 0x20));
  if (iVar4 == -1) {
    TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
              (in_stack_ffffffffffffe3a0,in_stack_ffffffffffffe398,
               (int64_t)in_stack_ffffffffffffe390);
    pztopology::TPZLine::TShape<Fad<double>>
              ((TPZVec<Fad<double>_> *)CONCAT44(in_stack_ffffffffffffe424,in_stack_ffffffffffffe420)
               ,(TPZFMatrix<Fad<double>_> *)
                CONCAT44(in_stack_ffffffffffffe41c,in_stack_ffffffffffffe418),
               in_stack_ffffffffffffe410);
    for (local_57c = 0; local_57c < 2; local_57c = local_57c + 1) {
      for (local_580 = 0; local_580 < 3; local_580 = local_580 + 1) {
        TPZFMatrix<double>::operator()
                  ((TPZFMatrix<double> *)in_stack_ffffffffffffe360,
                   (int64_t)in_stack_ffffffffffffe358,(int64_t)in_stack_ffffffffffffe350);
        TPZFMatrix<Fad<double>_>::operator()
                  (in_stack_ffffffffffffe360,(int64_t)in_stack_ffffffffffffe358,
                   (int64_t)in_stack_ffffffffffffe350);
        operator*<double,_Fad<double>,_nullptr>
                  ((double)in_stack_ffffffffffffe388,
                   (Fad<double> *)CONCAT17(in_stack_ffffffffffffe387,in_stack_ffffffffffffe380));
        TPZVec<Fad<double>_>::operator[](local_20,(long)local_580);
        Fad<double>::operator+=
                  ((Fad<double> *)in_stack_ffffffffffffe370,
                   (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe368
                  );
        FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe340
                  );
      }
    }
    local_5d9 = 0;
    TPZManVector<bool,_20>::TPZManVector
              (in_stack_ffffffffffffe370,(int64_t)in_stack_ffffffffffffe368,
               (bool *)in_stack_ffffffffffffe360);
    for (local_5e0 = 0; local_5e0 < 0; local_5e0 = local_5e0 + 1) {
      local_5e4 = local_5e0 + 2;
      bVar1 = pztopology::TPZLine::CheckProjectionForSingularity<Fad<double>>(&local_5e4,local_18);
      pbVar5 = TPZVec<bool>::operator[](local_5d8,(long)local_5e0);
      *pbVar5 = bVar1;
    }
    local_8b0 = 0;
    Fad<double>::Fad<double,_nullptr>
              ((Fad<double> *)in_stack_ffffffffffffe350,(double *)in_stack_ffffffffffffe348);
    TPZManVector<Fad<double>,_20>::TPZManVector
              (in_stack_ffffffffffffe3f0,(int64_t)in_stack_ffffffffffffe3e8,
               (Fad<double> *)in_stack_ffffffffffffe3e0);
    Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffe340);
    local_ce8 = 0;
    Fad<double>::Fad<double,_nullptr>
              ((Fad<double> *)in_stack_ffffffffffffe350,(double *)in_stack_ffffffffffffe348);
    TPZFNMatrix<27,_Fad<double>_>::TPZFNMatrix
              (in_stack_ffffffffffffe3d0,in_stack_ffffffffffffe3c8,
               CONCAT44(in_stack_ffffffffffffe3c4,in_stack_ffffffffffffe3c0),
               in_stack_ffffffffffffe3b8);
    Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffe340);
    local_1120 = 0;
    Fad<double>::Fad<double,_nullptr>
              ((Fad<double> *)in_stack_ffffffffffffe350,(double *)in_stack_ffffffffffffe348);
    TPZFNMatrix<27,_Fad<double>_>::TPZFNMatrix
              (in_stack_ffffffffffffe3d0,in_stack_ffffffffffffe3c8,
               CONCAT44(in_stack_ffffffffffffe3c4,in_stack_ffffffffffffe3c0),
               in_stack_ffffffffffffe3b8);
    Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffe340);
    local_1558 = 0;
    Fad<double>::Fad<double,_nullptr>
              ((Fad<double> *)in_stack_ffffffffffffe350,(double *)in_stack_ffffffffffffe348);
    TPZFNMatrix<27,_Fad<double>_>::TPZFNMatrix
              (in_stack_ffffffffffffe3d0,in_stack_ffffffffffffe3c8,
               CONCAT44(in_stack_ffffffffffffe3c4,in_stack_ffffffffffffe3c0),
               in_stack_ffffffffffffe3b8);
    Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffe340);
    for (local_155c = 0; local_155c < 0; local_155c = local_155c + 1) {
      local_1560 = local_155c + 2;
      this_00 = (TPZFMatrix<Fad<double>_> *)TPZVec<bool>::operator[](local_5d8,(long)local_155c);
      if (((ulong)(this_00->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable & 1) != 0) {
        TPZGeoElSide::TPZGeoElSide
                  ((TPZGeoElSide *)in_stack_ffffffffffffe360,
                   (TPZGeoElSideIndex *)in_stack_ffffffffffffe358,in_stack_ffffffffffffe350);
        bVar1 = IsLinearMapping(in_stack_ffffffffffffe3e8,
                                (int)((ulong)in_stack_ffffffffffffe3e0 >> 0x20));
        in_stack_ffffffffffffe434 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffe434);
        if ((bVar1) || (iVar2 = TPZGeoElSide::Exists(&local_1578), iVar2 == 0)) {
          in_stack_ffffffffffffe428 = TPZVec<Fad<double>_>::operator[](local_888,(long)local_155c);
          Fad<double>::operator=<int,_nullptr>
                    ((Fad<double> *)in_stack_ffffffffffffe350,(int *)in_stack_ffffffffffffe348);
          local_3a4 = 0xd;
        }
        else {
          TPZManVector<Fad<double>,_3>::TPZManVector
                    (in_stack_ffffffffffffe3e0,(int64_t)in_stack_ffffffffffffe3d8);
          pztopology::TPZLine::MapToSide<Fad<double>>
                    (in_stack_ffffffffffffe804,in_stack_ffffffffffffe7f8,in_stack_ffffffffffffe7f0,
                     (TPZFMatrix<Fad<double>_> *)
                     CONCAT44(in_stack_ffffffffffffe7ec,in_stack_ffffffffffffe7e8));
          pztopology::TPZLine::Type(local_1560);
          iVar3 = MElementType_NNodes((MElementType)in_stack_ffffffffffffe340);
          TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
                    (in_stack_ffffffffffffe3a0,in_stack_ffffffffffffe398,
                     (int64_t)in_stack_ffffffffffffe390);
          TPZFMatrix<Fad<double>_>::Resize
                    (this_00,CONCAT44(in_stack_ffffffffffffe434,iVar2),
                     (int64_t)in_stack_ffffffffffffe428);
          GetSideShapeFunction<pzgeom::TPZGeoLinear>
                    (in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe598,in_stack_ffffffffffffe590,
                     in_stack_ffffffffffffe588);
          TPZManVector<double,_3>::TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_ffffffffffffe360,
                     (int64_t)in_stack_ffffffffffffe358);
          for (in_stack_ffffffffffffe7ec = 0; in_stack_ffffffffffffe7ec < iVar3;
              in_stack_ffffffffffffe7ec = in_stack_ffffffffffffe7ec + 1) {
            in_stack_ffffffffffffe7e8 =
                 pztopology::TPZLine::SideNodeLocId
                           ((int)in_stack_ffffffffffffe340,
                            (int)((ulong)in_stack_ffffffffffffe338 >> 0x20));
            for (local_181c = 0; local_181c < 3; local_181c = local_181c + 1) {
              TPZFMatrix<double>::operator()
                        ((TPZFMatrix<double> *)in_stack_ffffffffffffe360,
                         (int64_t)in_stack_ffffffffffffe358,(int64_t)in_stack_ffffffffffffe350);
              TPZFMatrix<Fad<double>_>::operator()
                        (in_stack_ffffffffffffe360,(int64_t)in_stack_ffffffffffffe358,
                         (int64_t)in_stack_ffffffffffffe350);
              operator*<double,_Fad<double>,_nullptr>
                        ((double)in_stack_ffffffffffffe388,
                         (Fad<double> *)
                         CONCAT17(in_stack_ffffffffffffe387,in_stack_ffffffffffffe380));
              TPZFMatrix<Fad<double>_>::operator()
                        (in_stack_ffffffffffffe360,(int64_t)in_stack_ffffffffffffe358,
                         (int64_t)in_stack_ffffffffffffe350);
              Fad<double>::operator+=
                        ((Fad<double> *)in_stack_ffffffffffffe370,
                         (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
                         in_stack_ffffffffffffe368);
              FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
                        ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
                         in_stack_ffffffffffffe340);
            }
            pztopology::TPZLine::ParametricDomainNodeCoord
                      ((int)((ulong)in_stack_ffffffffffffe350 >> 0x20),
                       (TPZVec<double> *)in_stack_ffffffffffffe348);
            for (local_1844 = 0; local_1844 < 1; local_1844 = local_1844 + 1) {
              in_stack_ffffffffffffe3f0 =
                   (TPZManVector<Fad<double>,_20> *)
                   TPZVec<double>::operator[]
                             ((TPZVec<double> *)&stack0xffffffffffffe7f0,(long)local_1844);
              in_stack_ffffffffffffe3e0 =
                   (TPZManVector<Fad<double>,_3> *)
                   (in_stack_ffffffffffffe3f0->super_TPZVec<Fad<double>_>)._vptr_TPZVec;
              in_stack_ffffffffffffe3e8 =
                   (TPZGeoBlend<pzgeom::TPZGeoLinear> *)
                   TPZFMatrix<Fad<double>_>::operator()
                             (in_stack_ffffffffffffe360,(int64_t)in_stack_ffffffffffffe358,
                              (int64_t)in_stack_ffffffffffffe350);
              operator*<double,_Fad<double>,_nullptr>
                        ((double)in_stack_ffffffffffffe388,
                         (Fad<double> *)
                         CONCAT17(in_stack_ffffffffffffe387,in_stack_ffffffffffffe380));
              in_stack_ffffffffffffe3d8 =
                   TPZFMatrix<Fad<double>_>::operator()
                             (in_stack_ffffffffffffe360,(int64_t)in_stack_ffffffffffffe358,
                              (int64_t)in_stack_ffffffffffffe350);
              Fad<double>::operator+=
                        ((Fad<double> *)in_stack_ffffffffffffe370,
                         (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
                         in_stack_ffffffffffffe368);
              FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
                        ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
                         in_stack_ffffffffffffe340);
            }
          }
          TPZVec<Fad<double>_>::operator[](local_888,(long)local_155c);
          pztopology::TPZLine::BlendFactorForSide<Fad<double>>
                    (in_stack_ffffffffffffe6d0,in_stack_ffffffffffffe6c8,in_stack_ffffffffffffe6c0,
                     in_stack_ffffffffffffe6b8);
          TPZGeoElSide::Dimension((TPZGeoElSide *)in_stack_ffffffffffffe340);
          TPZManVector<Fad<double>,_3>::TPZManVector
                    (in_stack_ffffffffffffe3e0,(int64_t)in_stack_ffffffffffffe3d8);
          bVar1 = MapToNeighSide<Fad<double>>
                            (in_stack_ffffffffffffe8c8,in_stack_ffffffffffffe8c4,
                             in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
                             in_stack_ffffffffffffe8b0,in_stack_ffffffffffffe8a8);
          if (bVar1) {
            local_1998 = 0;
            Fad<double>::Fad<double,_nullptr>
                      ((Fad<double> *)in_stack_ffffffffffffe350,(double *)in_stack_ffffffffffffe348)
            ;
            TPZManVector<Fad<double>,_3>::TPZManVector
                      ((TPZManVector<Fad<double>,_3> *)in_stack_ffffffffffffe3f0,
                       (int64_t)in_stack_ffffffffffffe3e8,(Fad<double> *)in_stack_ffffffffffffe3e0);
            Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffe340);
            Neighbour(in_stack_ffffffffffffe358,(int)((ulong)in_stack_ffffffffffffe350 >> 0x20),
                      in_stack_ffffffffffffe348);
            TPZGeoElSide::X((TPZGeoElSide *)in_stack_ffffffffffffe8b0,
                            (TPZVec<Fad<double>_> *)in_stack_ffffffffffffe8a8,
                            in_stack_ffffffffffffe8a0);
            for (local_19b4 = 0; local_19b4 < 3; local_19b4 = local_19b4 + 1) {
              TPZVec<Fad<double>_>::operator[](&local_1970,(long)local_19b4);
              TPZFMatrix<Fad<double>_>::operator()
                        (in_stack_ffffffffffffe360,(int64_t)in_stack_ffffffffffffe358,
                         (int64_t)in_stack_ffffffffffffe350);
              Fad<double>::operator=
                        ((Fad<double> *)in_stack_ffffffffffffe340,in_stack_ffffffffffffe338);
            }
            TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)in_stack_ffffffffffffe350);
            pztopology::TPZLine::LowerDimensionSides
                      ((int)((ulong)in_stack_ffffffffffffe350 >> 0x20),
                       (TPZStack<int,_10> *)in_stack_ffffffffffffe348,
                       (int)((ulong)in_stack_ffffffffffffe340 >> 0x20));
            TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)in_stack_ffffffffffffe350);
            pztopology::TPZLine::LowerDimensionSides
                      ((int)((ulong)in_stack_ffffffffffffe350 >> 0x20),
                       (TPZStack<int,_10> *)in_stack_ffffffffffffe348);
            iVar4 = TPZVec<int>::NElements(local_1a00);
            local_1a4c = (int)iVar4;
            while( true ) {
              in_stack_ffffffffffffe398 = (long)local_1a4c;
              in_stack_ffffffffffffe3a0 =
                   (TPZFNMatrix<9,_Fad<double>_> *)TPZVec<int>::NElements(local_1a48);
              if ((long)in_stack_ffffffffffffe3a0 <= in_stack_ffffffffffffe398) break;
              in_stack_ffffffffffffe390 =
                   (TPZVec<Fad<double>_> *)TPZVec<int>::operator[](local_1a48,(long)local_1a4c);
              in_stack_ffffffffffffe388 =
                   (Fad<double> *)
                   TPZVec<bool>::operator[]
                             (local_5d8,
                              (long)(*(int *)&in_stack_ffffffffffffe390->_vptr_TPZVec + -2));
              if ((((ulong)in_stack_ffffffffffffe388->val_ & 1) != 0) &&
                 (in_stack_ffffffffffffe387 =
                       IsLinearMapping(in_stack_ffffffffffffe3e8,
                                       (int)((ulong)in_stack_ffffffffffffe3e0 >> 0x20)),
                 !(bool)in_stack_ffffffffffffe387)) {
                Fad<double>::Fad<int,_nullptr>
                          ((Fad<double> *)in_stack_ffffffffffffe350,(int *)in_stack_ffffffffffffe348
                          );
                TPZManVector<Fad<double>,_3>::TPZManVector
                          ((TPZManVector<Fad<double>,_3> *)in_stack_ffffffffffffe3f0,
                           (int64_t)in_stack_ffffffffffffe3e8,
                           (Fad<double> *)in_stack_ffffffffffffe3e0);
                Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffe340);
                for (local_1af8 = 0; local_1af8 < 1; local_1af8 = local_1af8 + 1) {
                  in_stack_ffffffffffffe378 =
                       TPZFMatrix<Fad<double>_>::operator()
                                 (in_stack_ffffffffffffe360,(int64_t)in_stack_ffffffffffffe358,
                                  (int64_t)in_stack_ffffffffffffe350);
                  in_stack_ffffffffffffe370 =
                       (TPZManVector<bool,_20> *)
                       TPZVec<Fad<double>_>::operator[](local_1ad0,(long)local_1af8);
                  Fad<double>::operator=
                            ((Fad<double> *)in_stack_ffffffffffffe340,in_stack_ffffffffffffe338);
                }
                Fad<double>::Fad<int,_nullptr>
                          ((Fad<double> *)in_stack_ffffffffffffe350,(int *)in_stack_ffffffffffffe348
                          );
                pztopology::TPZLine::BlendFactorForSide<Fad<double>>
                          (in_stack_ffffffffffffe6d0,in_stack_ffffffffffffe6c8,
                           in_stack_ffffffffffffe6c0,in_stack_ffffffffffffe6b8);
                for (local_1b20 = 0; local_1b20 < 3; local_1b20 = local_1b20 + 1) {
                  in_stack_ffffffffffffe368 =
                       TPZFMatrix<Fad<double>_>::operator()
                                 (in_stack_ffffffffffffe360,(int64_t)in_stack_ffffffffffffe358,
                                  (int64_t)in_stack_ffffffffffffe350);
                  in_stack_ffffffffffffe360 =
                       (TPZFMatrix<Fad<double>_> *)
                       TPZFMatrix<Fad<double>_>::operator()
                                 (in_stack_ffffffffffffe360,(int64_t)in_stack_ffffffffffffe358,
                                  (int64_t)in_stack_ffffffffffffe350);
                  operator-<Fad<double>,_Fad<double>,_nullptr>
                            (in_stack_ffffffffffffe378,(Fad<double> *)in_stack_ffffffffffffe370);
                  operator*<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_nullptr>
                            (in_stack_ffffffffffffe378,
                             (FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)
                             in_stack_ffffffffffffe370);
                  in_stack_ffffffffffffe358 =
                       (TPZGeoBlend<pzgeom::TPZGeoLinear> *)
                       TPZFMatrix<Fad<double>_>::operator()
                                 (in_stack_ffffffffffffe360,(int64_t)in_stack_ffffffffffffe358,
                                  (int64_t)in_stack_ffffffffffffe350);
                  Fad<double>::operator-=
                            ((Fad<double> *)in_stack_ffffffffffffe370,
                             (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                              *)in_stack_ffffffffffffe368);
                  FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                  ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                              *)in_stack_ffffffffffffe340);
                  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
                            ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)
                             in_stack_ffffffffffffe340);
                }
                Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffe340);
                TPZManVector<Fad<double>,_3>::~TPZManVector
                          ((TPZManVector<Fad<double>,_3> *)in_stack_ffffffffffffe350);
              }
              local_1a4c = local_1a4c + 1;
            }
            for (local_1b44 = 0; local_1b44 < 3; local_1b44 = local_1b44 + 1) {
              in_stack_ffffffffffffe350 =
                   (TPZGeoMesh *)TPZVec<Fad<double>_>::operator[](local_888,(long)local_155c);
              in_stack_ffffffffffffe348 =
                   (TPZGeoMesh *)
                   TPZFMatrix<Fad<double>_>::operator()
                             (in_stack_ffffffffffffe360,(int64_t)in_stack_ffffffffffffe358,
                              (int64_t)in_stack_ffffffffffffe350);
              in_stack_ffffffffffffe340 =
                   (TPZManVector<bool,_20> *)
                   TPZFMatrix<Fad<double>_>::operator()
                             (in_stack_ffffffffffffe360,(int64_t)in_stack_ffffffffffffe358,
                              (int64_t)in_stack_ffffffffffffe350);
              operator-<Fad<double>,_Fad<double>,_nullptr>
                        (in_stack_ffffffffffffe378,(Fad<double> *)in_stack_ffffffffffffe370);
              operator*<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_nullptr>
                        (in_stack_ffffffffffffe378,
                         (FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)
                         in_stack_ffffffffffffe370);
              in_stack_ffffffffffffe338 =
                   TPZVec<Fad<double>_>::operator[](local_20,(long)local_1b44);
              Fad<double>::operator+=
                        ((Fad<double> *)in_stack_ffffffffffffe370,
                         (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                          *)in_stack_ffffffffffffe368);
              FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
              ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                          *)in_stack_ffffffffffffe340);
              FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
                        ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)
                         in_stack_ffffffffffffe340);
            }
            TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x16799ad);
            TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x16799ba);
            TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x16799c7);
            TPZManVector<Fad<double>,_3>::~TPZManVector
                      ((TPZManVector<Fad<double>,_3> *)in_stack_ffffffffffffe350);
            local_3a4 = 0;
          }
          else {
            local_3a4 = 0xd;
          }
          TPZManVector<Fad<double>,_3>::~TPZManVector
                    ((TPZManVector<Fad<double>,_3> *)in_stack_ffffffffffffe350);
          TPZManVector<double,_3>::~TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_ffffffffffffe340);
          TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)0x1679a06);
          TPZManVector<Fad<double>,_3>::~TPZManVector
                    ((TPZManVector<Fad<double>,_3> *)in_stack_ffffffffffffe350);
        }
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1679a20);
      }
    }
    TPZFNMatrix<27,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<27,_Fad<double>_> *)0x1679acb);
    TPZFNMatrix<27,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<27,_Fad<double>_> *)0x1679ad8);
    TPZFNMatrix<27,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<27,_Fad<double>_> *)0x1679ae5);
    TPZManVector<Fad<double>,_20>::~TPZManVector
              ((TPZManVector<Fad<double>,_20> *)in_stack_ffffffffffffe350);
    TPZManVector<bool,_20>::~TPZManVector(in_stack_ffffffffffffe340);
    TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)0x1679b0c);
    local_3a4 = 0;
  }
  else {
    TPZManVector<Fad<double>,_3>::TPZManVector
              (in_stack_ffffffffffffe3e0,(int64_t)in_stack_ffffffffffffe3d8);
    bVar1 = MapToNeighSide<Fad<double>>
                      (in_stack_ffffffffffffe8c8,in_stack_ffffffffffffe8c4,in_stack_ffffffffffffe8c0
                       ,in_stack_ffffffffffffe8b8,in_stack_ffffffffffffe8b0,
                       in_stack_ffffffffffffe8a8);
    if (!bVar1) {
      pzinternal::DebugStopImpl(in_stack_ffffffffffffe760,in_stack_ffffffffffffe758);
    }
    Neighbour(in_stack_ffffffffffffe358,(int)((ulong)in_stack_ffffffffffffe350 >> 0x20),
              in_stack_ffffffffffffe348);
    TPZGeoElSide::X((TPZGeoElSide *)in_stack_ffffffffffffe8b0,
                    (TPZVec<Fad<double>_> *)in_stack_ffffffffffffe8a8,in_stack_ffffffffffffe8a0);
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1678750);
    local_3a4 = 1;
    TPZManVector<Fad<double>,_3>::~TPZManVector
              ((TPZManVector<Fad<double>,_3> *)in_stack_ffffffffffffe350);
  }
  TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)0x1679b24);
  TPZManVector<Fad<double>,_3>::~TPZManVector
            ((TPZManVector<Fad<double>,_3> *)in_stack_ffffffffffffe350);
  return;
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::X(TPZFMatrix<REAL> &coord, TPZVec<T> &xi, TPZVec<T> &result) const {
//    TPZGeoEl &gel = *fGeoEl;
    if(!fGeoEl) DebugStop();
    TPZGeoMesh *gmesh = fGeoEl->Mesh();
    TPZManVector<T,3> notUsedHereVec(3,(T)0);
    TPZFNMatrix<9,T> notUsedHereMat(TGeo::NSides, TGeo::NSides,(T)0);//since some methods dont resize the matrix, it is
    // bigger than needed.

    #ifdef PZ_LOG
    std::ostringstream soutLogDebug;
    if(logger.isDebugEnabled())
    {
        soutLogDebug << "TPZGeoBlend<" <<MElementType_Name(TGeo::Type())<<">::X2_______REF_1"<<std::endl;
        soutLogDebug << "element id " <<fGeoEl->Id()<<std::endl;
        soutLogDebug << "xi: ";
        for(int i = 0; i < xi.size(); i++) soutLogDebug<<xi[i]<<"\n";
        soutLogDebug<<std::endl;
    }
    #endif
    const REAL zero = 1e-14;
    result.Resize(3);
    result.Fill(0);

    if (fNeighbours[TGeo::NSides - 1 -TGeo::NNodes].ElementIndex() != -1){
        TPZManVector<T, 3> neighXi;
        if (!MapToNeighSide(TGeo::NSides-1, TGeo::Dimension, xi, neighXi, notUsedHereMat)) {
#ifdef PZ_LOG2
            if(logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "MapToNeighSide is singular for par " << xi << " and side " << TGeo::NSides-1 << ". Aborting...";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            DebugStop();
        }
        Neighbour(TGeo::NSides-1, gmesh).X(neighXi, result);
        return;
    }

    /**
     * The non-linear mapping is calculated from deviations of the linear mapping.
     * The linear mapping of an element (or of any of its side) can be calculated with the barycentric coordinates
     * of the nodes contained in it
     */
    TPZFNMatrix<9, T> phi(TGeo::NNodes, 1);
    TGeo::TShape(xi, phi, notUsedHereMat);//gets the barycentric coordinates


    for (int iNode = 0; iNode < TGeo::NNodes; iNode++) {//calculates the linear mapping
        for (int x = 0; x < 3; x++) {
            result[x] += coord(x, iNode) * phi(iNode, 0);
        }
    }
    #ifdef PZ_LOG
    if(logger.isDebugEnabled())
    {
        soutLogDebug << "Linear mapping:\n"<<std::endl;
        for(int i = 0; i < result.size(); i++) soutLogDebug<<result[i]<<"\n";
        soutLogDebug<<std::endl;
    }
    #endif

    /**
     * Now, the deviation for any non-linearity of the sides' mappings must be taken into account.
     */
    TPZManVector<bool, 20> isRegularMapping(TGeo::NSides - TGeo::NNodes, 0.);
    for (int sideIndex = 0; sideIndex < TGeo::NSides - TGeo::NNodes - 1; sideIndex++) {
        int side = TGeo::NNodes + sideIndex;
        isRegularMapping[sideIndex] = TGeo::CheckProjectionForSingularity(side,xi);
    }

    TPZManVector<T, 20> blendFactor(TGeo::NSides - TGeo::NNodes, 0.);
    TPZFNMatrix<27, T> projectedPointOverSide(TGeo::NSides - TGeo::NNodes, TGeo::Dimension, 0.);
    TPZFNMatrix<27, T> linearSideMappings(TGeo::NSides - TGeo::NNodes, 3, 0.);
    TPZFNMatrix<27, T> nonLinearSideMappings(TGeo::NSides - TGeo::NNodes, 3, 0.);
    for (int sideIndex = 0; sideIndex < TGeo::NSides - TGeo::NNodes - 1; sideIndex++) {
        int side = TGeo::NNodes + sideIndex;
        if(!isRegularMapping[sideIndex]) {
            #ifdef PZ_LOG
            if(logger.isDebugEnabled()){
                soutLogDebug <<"mapping is not regular. skipping side... ";

            }
            #endif
            continue;
        }
        TPZGeoElSide gelside(fNeighbours[sideIndex], gmesh);
        #ifdef PZ_LOG
        if(logger.isDebugEnabled())
        {
            soutLogDebug << "================================" <<std::endl;
            soutLogDebug << "side: "<<side<<" is linear: ";
        }
        #endif
        if (IsLinearMapping(side) || !gelside.Exists()) {
            blendFactor[sideIndex] = 0;
            #ifdef PZ_LOG
            if(logger.isDebugEnabled()){
                if( IsLinearMapping(side) )  soutLogDebug <<"true"<<std::endl;
                else    soutLogDebug <<"false (no gelside) "<<std::endl;
            }
            #endif
            continue;
        }
        #ifdef PZ_LOG
        if(logger.isDebugEnabled()){
            soutLogDebug <<"false (gelside exists) "<<std::endl;
        }
        #endif
        /**
     * Calculates the linear mapping of the side sideIndex, and the projected point on sideIndex
     */
        TPZManVector<T, 3>  sideXi;
        this->MapToSide(side, xi, sideXi, notUsedHereMat);

        MElementType sideType = TGeo::Type(side);
        const int nSideNodes = MElementType_NNodes(sideType);
        TPZFNMatrix<9, T> sidePhi(nSideNodes, 1);
        notUsedHereMat.Resize(TGeo::Dimension,nSideNodes);
        GetSideShapeFunction<TGeo>(side, sideXi, sidePhi, notUsedHereMat);

        TPZManVector<REAL,3> nodeCoord;
        for (int iNode = 0; iNode < nSideNodes; iNode++) {
            const int currentNode = TGeo::SideNodeLocId(side, iNode);

            for (int x = 0; x < 3; x++) {
                linearSideMappings(sideIndex, x) +=
                        coord(x, currentNode) * sidePhi(iNode, 0);
            }
            TGeo::ParametricDomainNodeCoord(currentNode,nodeCoord);
            for (int x = 0; x < TGeo::Dimension; x++) {
                projectedPointOverSide(sideIndex,x) += nodeCoord[x] * sidePhi(iNode,0);
            }
        }
        /**
         * Calculates the non-linear mapping of the side sideIndex
         */
        #ifdef PZ_LOG
        if(logger.isDebugEnabled()){
            soutLogDebug <<"xi projection over side:\n";
            for (int x = 0; x < TGeo::Dimension; x++) soutLogDebug<<projectedPointOverSide(sideIndex,x)<<"\n";
            soutLogDebug<<std::endl<<"xi projection in side domain:\n";
            for (int x = 0; x < sideXi.size(); x++) soutLogDebug<<sideXi[x]<<"\n";
            soutLogDebug<<std::endl<<"linear mapping of projected point:\n";
            for (int x = 0; x < 3; x++) soutLogDebug<<linearSideMappings(sideIndex, x)<<"\n";
        }
        #endif

        TGeo::BlendFactorForSide(side, xi, blendFactor[sideIndex], notUsedHereVec);
        int sidedim = gelside.Dimension();
        TPZManVector<T, 3> neighXi;
        if (!MapToNeighSide(side, sidedim, xi, neighXi, notUsedHereMat)) {
#ifdef PZ_LOG2
            if(logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "MapToNeighSide is singular for par " << par << " and side " << byside << " skipping the side ";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            continue;
        }
        TPZManVector<T, 3> Xside(3, 0.);
        TPZGeoElSide neighbour = Neighbour(side, gmesh);
        neighbour.X(neighXi, Xside);
        for (int x = 0; x < 3; x++) {
            nonLinearSideMappings(sideIndex, x) = Xside[x];
        }

//        else{
        TPZStack<int> containedNodesInSide;
        TGeo::LowerDimensionSides(side, containedNodesInSide, 0);

        TPZStack<int> allContainedSides;
        TGeo::LowerDimensionSides(side, allContainedSides);
        for (int subSideIndex = containedNodesInSide.NElements();
             subSideIndex < allContainedSides.NElements(); subSideIndex++) {
            const int subSide = allContainedSides[subSideIndex];
#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\tSubside " << subSideIndex << " (global: " << subSide << ") is linear: ";
                if (IsLinearMapping(subSide)) soutLogDebug << "true" << std::endl;
                else soutLogDebug << "false" << std::endl;
            }
#endif
            if(!isRegularMapping[subSide - TGeo::NNodes]) {
                #ifdef PZ_LOG
                if(logger.isDebugEnabled()){
                    soutLogDebug <<"mapping of subside is not regular. skipping side... ";

                }
                #endif
                continue;
            }
            if (IsLinearMapping(subSide)) continue;
            TPZManVector<T, 3> projectedPoint(TGeo::Dimension, -1);
            for (int x = 0; x < TGeo::Dimension; x++) {
                projectedPoint[x] = projectedPointOverSide(sideIndex, x);
            }

            T blendFactorSide = -1;
            TGeo::BlendFactorForSide(subSide, projectedPoint, blendFactorSide,notUsedHereVec);

#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\tSubside influence :" << blendFactorSide << std::endl;
            }
#endif
            for (int x = 0; x < 3; x++) {
                nonLinearSideMappings(sideIndex, x) -=
                        blendFactorSide *
                        (nonLinearSideMappings(subSide - TGeo::NNodes, x) -
                         linearSideMappings(subSide - TGeo::NNodes, x));
            }

        }
//        }
#ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "Non-linear mapping\n";
            for (int x = 0; x < 3; x++) soutLogDebug << nonLinearSideMappings(sideIndex, x) << "\n";
            soutLogDebug << std::endl;

            soutLogDebug << "adding to result mapping of side: " << side << std::endl;
            soutLogDebug << "\t\tblend factor: " << blendFactor[sideIndex] << std::endl;
//            LOGPZ_DEBUG(logger,soutLogDebug.str())
//            soutLogDebug.str("");
        }
#endif
        for (int x = 0; x < 3; x++) {
            result[x] += blendFactor[sideIndex] *
                         (nonLinearSideMappings(sideIndex, x) - linearSideMappings(sideIndex, x));
        }
    }
#ifdef PZ_LOG
    if(logger.isDebugEnabled()){
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "=============result=============" <<std::endl;
        soutLogDebug <<"================================"<<std::endl;
        for (int x = 0; x < 3; x++) soutLogDebug<<result[x]<<"\n";
        soutLogDebug << "\n================================" <<std::endl;
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "================================" <<std::endl;
        LOGPZ_DEBUG(logger,soutLogDebug.str())
        soutLogDebug.str("");
    }
#endif
}